

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

quaternion * quaternion_slerp(quaternion *start,quaternion *end,double percent,quaternion *qR)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  quaternion qneg;
  anon_union_32_3_07544b10_for_quaternion_0 local_38;
  
  dVar2 = -percent;
  if (-percent <= percent) {
    dVar2 = percent;
  }
  if (dVar2 < 1e-05) {
    dVar2 = (start->field_0).q[0];
    dVar1 = (start->field_0).q[1];
    dVar4 = (start->field_0).q[2];
    dVar3 = (start->field_0).q[3];
  }
  else {
    dVar1 = percent + -1.0;
    dVar2 = -dVar1;
    if (-dVar1 <= dVar1) {
      dVar2 = dVar1;
    }
    if (1e-05 <= dVar2) {
      dVar1 = (start->field_0).q[3] * (end->field_0).q[3] +
              (start->field_0).q[2] * (end->field_0).q[2] +
              (start->field_0).q[0] * (end->field_0).q[0] +
              (start->field_0).q[1] * (end->field_0).q[1];
      dVar4 = dVar1 + -1.0;
      dVar2 = -dVar4;
      if (-dVar4 <= dVar4) {
        dVar2 = dVar4;
      }
      if (1e-05 <= dVar2) {
        if (dVar1 < 0.0) {
          local_38.q[0] = -(end->field_0).q[0];
          local_38.q[1] = -(end->field_0).q[1];
          local_38.q[2] = -(end->field_0).q[2];
          local_38.q[3] = -(end->field_0).q[3];
          quaternion_slerp(start,(quaternion *)&local_38.field_1,percent,qR);
          dVar2 = (qR->field_0).q[1];
          dVar1 = (qR->field_0).q[2];
          dVar4 = (qR->field_0).q[3];
          (qR->field_0).q[0] = -(qR->field_0).q[0];
          (qR->field_0).q[1] = -dVar2;
          (qR->field_0).q[2] = -dVar1;
          (qR->field_0).q[3] = -dVar4;
          return qR;
        }
        dVar2 = acos(dVar1);
        dVar1 = sin(dVar2);
        dVar4 = sin((1.0 - percent) * dVar2);
        dVar4 = dVar4 / dVar1;
        dVar2 = sin(dVar2 * percent);
        dVar2 = dVar2 / dVar1;
        (qR->field_0).q[3] = (start->field_0).q[3] * dVar4 + (end->field_0).q[3] * dVar2;
        (qR->field_0).q[0] = (start->field_0).q[0] * dVar4 + (end->field_0).q[0] * dVar2;
        (qR->field_0).q[1] = (start->field_0).q[1] * dVar4 + (end->field_0).q[1] * dVar2;
        (qR->field_0).q[2] = dVar4 * (start->field_0).q[2] + dVar2 * (end->field_0).q[2];
        return qR;
      }
      quaternion_lerp(start,end,percent,qR);
      return qR;
    }
    dVar2 = (end->field_0).q[0];
    dVar1 = (end->field_0).q[1];
    dVar4 = (end->field_0).q[2];
    dVar3 = (end->field_0).q[3];
  }
  (qR->field_0).q[0] = dVar2;
  (qR->field_0).q[1] = dVar1;
  (qR->field_0).q[2] = dVar4;
  (qR->field_0).q[3] = dVar3;
  return qR;
}

Assistant:

HYPAPI struct quaternion *quaternion_slerp(const struct quaternion *start, const struct quaternion *end, HYP_FLOAT percent, struct quaternion *qR)
{
	HYP_FLOAT dot;
	HYP_FLOAT f1, f2;
	HYP_FLOAT theta;
	HYP_FLOAT s;
	struct quaternion qneg;

	/* if percent is 0, return start */
	if (scalar_equalsf(percent, 0.0f)) {
		quaternion_set(qR, start);
		return qR;
	}

	/* if percent is 1 return end */
	if (scalar_equalsf(percent, 1.0f)) {
		quaternion_set(qR, end);
		return qR;
	}

	/* how parallel are the quaternions (also the dot is the cosine) */
	dot = quaternion_dot_product(start, end);

	/* if they are close to parallel, use LERP
	 *	- This avoids div/0
	 *	- At small angles, the slerp and lerp are the same
	 */

	if (scalar_equalsf(dot, 1.0f)) {
		quaternion_lerp(start, end, percent, qR);
		return qR;
	}

	/* if dot is negative, they are "pointing" away from one another,
	 * use the shortest arc instead (reverse end and start)
	 * This has the effect of changing the direction of travel around
	 * the sphere beginning with "end" and going the other way around
	 * the sphere
	 */
	if (dot < 0.0f) {
		quaternion_set(&qneg, end);
		/*quaternion_conjugate(&qneg);*/
		quaternion_negate(&qneg);
		quaternion_slerp(start, &qneg, percent, qR);
		quaternion_negate(qR);
		/*quaternion_conjugate(qR);*/
		return qR;
	}

	/* keep the dot product in the range that acos can handle */
	/* (shouldn't get here) */
	HYP_CLAMP(dot, -1.0f, 1.0f);

	/* the angle between start and end in radians */
	theta = HYP_ACOS(dot);
	/* cache */
	s = HYP_SIN(theta);
	/* compute negative */
	f1 = HYP_SIN((1.0 - percent) * theta) / s;
	/* compute positive */
	f2 = HYP_SIN(percent * theta) / s;

	/* this expanded form avoids calling quaternion_multiply
	 * and quaternion_add
	 */
	qR->w = f1 * start->w + f2 * end->w;
	qR->x = f1 * start->x + f2 * end->x;
	qR->y = f1 * start->y + f2 * end->y;
	qR->z = f1 * start->z + f2 * end->z;

	return qR;
}